

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Parser::SkipStatement(Parser *this)

{
  bool bVar1;
  Parser *this_local;
  
  do {
    bVar1 = AtEnd(this);
    if (bVar1) {
      return;
    }
    bVar1 = LookingAtType(this,TYPE_SYMBOL);
    if (bVar1) {
      bVar1 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
      if (bVar1) {
        return;
      }
      bVar1 = TryConsume(this,"{");
      if (bVar1) {
        SkipRestOfBlock(this);
        return;
      }
      bVar1 = LookingAt(this,"}");
      if (bVar1) {
        return;
      }
    }
    io::Tokenizer::Next(this->input_);
  } while( true );
}

Assistant:

void Parser::SkipStatement() {
  while (true) {
    if (AtEnd()) {
      return;
    } else if (LookingAtType(io::Tokenizer::TYPE_SYMBOL)) {
      if (TryConsumeEndOfDeclaration(";", NULL)) {
        return;
      } else if (TryConsume("{")) {
        SkipRestOfBlock();
        return;
      } else if (LookingAt("}")) {
        return;
      }
    }
    input_->Next();
  }
}